

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
          (rule *this,
          vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *args,
          not_null<const_pstore::exchange::import_ns::string_mapping_*> args_1,
          shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
          *args_2)

{
  context *pcVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  pointer *__ptr;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_38;
  __uniq_ptr_impl<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_>_>
  local_30;
  vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *args_local;
  not_null<const_pstore::exchange::import_ns::string_mapping_*> args_local_1;
  
  pcVar1 = (this->context_).ptr_;
  args_local = args;
  args_local_1 = args_1;
  std::
  make_unique<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*&,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>&,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&local_30,
             (vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> **)
             &this->context_,
             (not_null<const_pstore::exchange::import_ns::string_mapping_*> *)&args_local,
             (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
              *)&args_local_1);
  local_38._M_head_impl =
       (rule *)local_30._M_t.
               super__Tuple_impl<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_>_>
               .
               super__Head_base<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*,_false>
               ._M_head_impl;
  local_30._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_>_>
  .
  super__Head_base<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*,_false>
  ._M_head_impl =
       (tuple<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_>_>
        )(_Tuple_impl<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_>_>
          )0x0;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
  ::
  emplace_back<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
            ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
              *)&pcVar1->stack,
             (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
              *)&local_38);
  if (local_38._M_head_impl != (rule *)0x0) {
    (*(local_38._M_head_impl)->_vptr_rule[1])();
  }
  local_38._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_>_>
                 *)&local_30);
  log_top(this,true);
  uVar3 = std::_V2::system_category();
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  return (error_code)(auVar2 << 0x40);
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }